

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

string * __thiscall
jessilib::
join_mbstring<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char8_t,std::char_traits<char8_t>>&>
          (string *__return_storage_ptr__,jessilib *this,
          basic_string_view<char8_t,_std::char_traits<char8_t>_> *args,
          basic_string_view<char8_t,_std::char_traits<char8_t>_> *args_1)

{
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *args_local_1;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *args_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  impl_join::
  join_mb_append<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char8_t,std::char_traits<char8_t>>&>
            ((impl_join *)__return_storage_ptr__,(string *)this,args,args_1);
  return __return_storage_ptr__;
}

Assistant:

std::string join_mbstring(ArgsT&&... args) {
	std::string result;
	impl_join::join_mb_append<ArgsT...>(result, std::forward<ArgsT>(args)...);
	return result;
}